

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_tester.cc
# Opt level: O3

void __thiscall
google::protobuf::MapReflectionTester::ReleaseLastMapsViaReflection
          (MapReflectionTester *this,Message *message)

{
  byte bVar1;
  FieldDescriptor *field;
  ushort *puVar2;
  Message *pMVar3;
  pointer ppFVar4;
  Nonnull<const_char_*> failure_msg;
  bool v1;
  pointer *__ptr_2;
  pointer *__ptr;
  pointer ppFVar5;
  char *in_R9;
  ulong uVar6;
  Metadata MVar7;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  output;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  AssertHelper local_80;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_78;
  internal local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string local_50;
  
  MVar7 = Message::GetMetadata(message);
  local_78.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(MVar7.reflection,message,&local_78);
  ppFVar5 = local_78.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_78.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_78.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 0;
    ppFVar4 = local_78.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      field = ppFVar5[uVar6];
      bVar1 = field->field_0x1;
      v1 = (bool)((bVar1 & 0x20) >> 5);
      if (0xbf < bVar1 != v1) {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (v1,0xbf < bVar1,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_50);
      }
      if (((bVar1 & 0x20) != 0) &&
         (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10)) {
        pMVar3 = Reflection::ReleaseLast(MVar7.reflection,message,field);
        local_60[0] = (internal)(pMVar3 != (Message *)0x0);
        local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (pMVar3 == (Message *)0x0) {
          testing::Message::Message((Message *)&local_88);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_88._M_head_impl + 0x10),"ReleaseLast returned nullptr for: ",
                     0x22);
          puVar2 = (ushort *)(field->all_names_).payload_;
          uVar6 = (ulong)*puVar2;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_88._M_head_impl + 0x10),(char *)((long)puVar2 + ~uVar6),uVar6
                    );
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,local_60,(AssertionResult *)"released != nullptr","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                     ,0x312,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_88._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_88._M_head_impl + 8))();
          }
          ppFVar5 = local_78.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58,local_58);
            ppFVar5 = local_78.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          break;
        }
        (*(pMVar3->super_MessageLite)._vptr_MessageLite[1])(pMVar3);
        ppFVar4 = local_78.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppFVar5 = local_78.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)ppFVar4 - (long)ppFVar5 >> 3));
  }
  if (ppFVar5 != (pointer)0x0) {
    operator_delete(ppFVar5,(long)local_78.
                                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppFVar5
                   );
  }
  return;
}

Assistant:

void MapReflectionTester::ReleaseLastMapsViaReflection(Message* message) {
  const Reflection* reflection = message->GetReflection();

  std::vector<const FieldDescriptor*> output;
  reflection->ListFields(*message, &output);
  for (int i = 0; i < output.size(); ++i) {
    const FieldDescriptor* field = output[i];
    if (!field->is_repeated()) continue;
    if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) continue;

    Message* released = reflection->ReleaseLast(message, field);
    ASSERT_TRUE(released != nullptr)
        << "ReleaseLast returned nullptr for: " << field->name();
    delete released;
  }
}